

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iface.c
# Opt level: O0

void nn_iface_any(int ipv4only,sockaddr_storage *result,size_t *resultlen)

{
  uint32_t uVar1;
  undefined8 *in_RDX;
  undefined2 *in_RSI;
  int in_EDI;
  
  if (in_EDI == 0) {
    if (in_RSI != (undefined2 *)0x0) {
      *in_RSI = 10;
      *(undefined8 *)(in_RSI + 4) = _in6addr_any;
      *(undefined8 *)(in_RSI + 8) = _write;
    }
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = 0x1c;
    }
  }
  else {
    if (in_RSI != (undefined2 *)0x0) {
      *in_RSI = 2;
      uVar1 = htonl(0);
      *(uint32_t *)(in_RSI + 2) = uVar1;
    }
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = 0x10;
    }
  }
  return;
}

Assistant:

static void nn_iface_any (int ipv4only, struct sockaddr_storage *result,
    size_t *resultlen)
{
    if (ipv4only) {
        if (result) {
            result->ss_family = AF_INET;
            ((struct sockaddr_in*) result)->sin_addr.s_addr =
                htonl (INADDR_ANY);
        }
        if (resultlen)
            *resultlen = sizeof (struct sockaddr_in);
    }
    else {
        if (result) {
            result->ss_family = AF_INET6;
            memcpy (&((struct sockaddr_in6*) result)->sin6_addr,
                &in6addr_any, sizeof (in6addr_any));
        }
        if (resultlen)
            *resultlen = sizeof (struct sockaddr_in6);
    }
}